

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

ObjectData * __thiscall
deqp::gles3::Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::genOccluderGeometry
          (ObjectData *__return_storage_ptr__,OccludingGeometryComplexityCostCase *this)

{
  uint uVar1;
  ObjectData *pOVar2;
  deUint32 dVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int x;
  ulong uVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar17;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar18;
  undefined4 extraout_XMM0_Dd;
  float fVar19;
  float fVar20;
  float local_238;
  float fStack_234;
  _Vector_base<float,_std::allocator<float>_> local_228;
  float local_208;
  float local_204;
  float local_200;
  undefined4 local_1fc;
  float local_1f8;
  float local_1f4;
  float local_1f0;
  undefined4 local_1ec;
  float local_1e8;
  float local_1e4;
  float local_1e0;
  undefined4 local_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  undefined4 local_1cc;
  float local_1c8;
  float local_1c4;
  float local_1c0;
  undefined4 local_1bc;
  float local_1b8;
  float local_1b4;
  float local_1b0;
  undefined4 local_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  float local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  float local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  ObjectData *local_160;
  ulong local_158;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> vertices;
  Random rng;
  ProgramSources local_100;
  
  Utils::getBaseShader();
  uVar1 = this->m_resolution;
  dVar3 = deStringHash((this->super_RenderCountCase).super_BaseCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  uVar4 = tcu::CommandLine::getBaseSeed
                    (((this->super_RenderCountCase).super_BaseCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_cmdLine);
  _local_1a8 = ZEXT416((uint)this->m_xyNoise);
  local_198 = ZEXT416((uint)this->m_zNoise);
  uVar5 = uVar1 + 1;
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&vertices,(long)(int)(uVar5 * uVar5),(allocator_type *)&local_208);
  local_160 = __return_storage_ptr__;
  dVar3 = ::deInt32Hash(dVar3);
  local_228._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228._M_impl.super__Vector_impl_data._M_finish = (float *)0x0;
  local_228._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deRandom_init(&rng.m_rnd,uVar4 ^ dVar3);
  fVar19 = (float)local_1a8._0_4_ + (float)local_1a8._0_4_;
  uVar16 = 0x80000000;
  uVar17 = 0x80000000;
  uVar18 = 0x80000000;
  fVar20 = -(float)local_198._0_4_;
  local_198._0_4_ = (float)local_198._0_4_ + (float)local_198._0_4_;
  lVar12 = 0;
  uVar4 = 0;
  if (0 < (int)uVar5) {
    uVar4 = uVar5;
  }
  fStack_1a0 = -(float)local_1a8._0_4_;
  fStack_19c = -(float)local_1a8._0_4_;
  local_1a8 = (undefined1  [8])(CONCAT44(local_1a8._0_4_,local_1a8._0_4_) ^ 0x8000000080000000);
  for (uVar9 = 0; uVar9 != uVar4; uVar9 = uVar9 + 1) {
    fVar14 = (float)(int)uVar9 / (float)(int)uVar1;
    local_188 = fVar14 + fVar14 + -1.0;
    uStack_184 = uVar16;
    uStack_180 = uVar17;
    uStack_17c = uVar18;
    for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
      fVar14 = (float)(int)uVar10 / (float)(int)uVar1;
      local_178 = fVar14 + fVar14 + -1.0;
      local_238 = 0.0;
      fStack_234 = 0.0;
      uStack_174 = uVar16;
      uStack_170 = uVar17;
      uStack_16c = uVar18;
      if ((((uVar9 != uVar1) && (uVar1 != uVar10)) && (uVar9 != 0)) && (uVar10 != 0)) {
        fVar14 = deRandom_getFloat(&rng.m_rnd);
        fVar15 = deRandom_getFloat(&rng.m_rnd);
        local_238 = fVar14 * fVar19 + (float)local_1a8._0_4_;
        fStack_234 = fVar15 * fVar19 + (float)local_1a8._4_4_;
      }
      fVar14 = deRandom_getFloat(&rng.m_rnd);
      iVar6 = (int)lVar12 + (int)uVar10;
      *(ulong *)vertices.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar6].m_data =
           CONCAT44(local_188 + fStack_234,local_178 + local_238);
      vertices.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar6].m_data[2] =
           fVar14 * (float)local_198._0_4_ + fVar20 + 0.2;
      uVar16 = extraout_XMM0_Db;
      uVar17 = extraout_XMM0_Dc;
      uVar18 = extraout_XMM0_Dd;
    }
    lVar12 = lVar12 + (ulong)uVar5;
  }
  std::vector<float,_std::allocator<float>_>::reserve
            ((vector<float,_std::allocator<float>_> *)&local_228,(long)(int)(uVar1 * uVar1 * 6));
  uVar4 = 0;
  local_188 = (float)0;
  if (0 < (int)uVar1) {
    local_188 = (float)uVar1;
  }
  fVar19 = (float)(uVar1 + 2);
  iVar6 = 1;
  local_158 = (ulong)uVar1;
  while ((float)uVar4 != local_188) {
    uVar4 = uVar4 + 1;
    uVar10 = local_158;
    local_178 = fVar19;
    iVar11 = iVar6;
    while (bVar13 = uVar10 != 0, uVar10 = uVar10 - 1, bVar13) {
      iVar7 = iVar11 + -1;
      iVar8 = (int)fVar19 + -1;
      local_208 = vertices.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar7].m_data[0];
      local_204 = vertices.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar7].m_data[1];
      local_200 = vertices.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar7].m_data[2];
      local_1fc = 0;
      local_1f8 = vertices.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[0];
      local_1f4 = vertices.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[1];
      local_1f0 = vertices.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[2];
      local_1ec = 0x3f800000;
      local_1e8 = vertices.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar11].m_data[0];
      local_1e4 = vertices.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar11].m_data[1];
      local_1e0 = vertices.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar11].m_data[2];
      local_1dc = 0x40000000;
      local_1d8 = vertices.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(int)fVar19].m_data[0];
      local_1d4 = vertices.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(int)fVar19].m_data[1];
      local_1d0 = vertices.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(int)fVar19].m_data[2];
      local_1cc = 0;
      local_1c8 = vertices.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar11].m_data[0];
      local_1c4 = vertices.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar11].m_data[1];
      local_1c0 = vertices.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar11].m_data[2];
      local_1bc = 0x3f800000;
      local_1b8 = vertices.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[0];
      local_1b4 = vertices.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[1];
      local_1b0 = vertices.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[2];
      local_1ac = 0x40000000;
      std::vector<float,std::allocator<float>>::insert<float_const*,void>
                ((vector<float,std::allocator<float>> *)&local_228,
                 (const_iterator)local_228._M_impl.super__Vector_impl_data._M_finish,&local_208,
                 (float *)local_1a8);
      fVar19 = (float)((int)fVar19 + 1);
      iVar11 = iVar11 + 1;
    }
    fVar19 = (float)((int)local_178 + uVar5);
    iVar6 = iVar6 + uVar5;
  }
  std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
            (&vertices.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>);
  pOVar2 = local_160;
  ObjectData::ObjectData(local_160,&local_100,(Geometry *)&local_228);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_228);
  glu::ProgramSources::~ProgramSources(&local_100);
  return pOVar2;
}

Assistant:

virtual ObjectData	genOccluderGeometry						(void) const
	{
		return ObjectData(Utils::getBaseShader(),
						  Utils::getFullScreenGrid(m_resolution,
						  deInt32Hash(deStringHash(getName())) ^ m_testCtx.getCommandLine().getBaseSeed(),
						  0.2f,
						  m_zNoise,
						  m_xyNoise));
	}